

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O1

int compare_dates(void *a,void *b)

{
  char *in_RAX;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *p;
  char *local_38;
  
  local_38 = in_RAX;
  lVar1 = strtol((char *)((long)a + 0x22),&local_38,10);
  lVar2 = strtol(local_38 + 1,&local_38,10);
  lVar3 = strtol(local_38 + 1,&local_38,10);
  lVar4 = strtol((char *)((long)b + 0x22),&local_38,10);
  lVar5 = strtol(local_38 + 1,&local_38,10);
  lVar6 = strtol(local_38 + 1,&local_38,10);
  return ((int)lVar1 - (int)lVar4) + ((int)lVar2 - (int)lVar5) * 100 +
         ((int)lVar3 - (int)lVar6) * 2000;
}

Assistant:

int compare_dates(const void *a, const void *b)
{
	FLevelStatistics *A = (FLevelStatistics*)a;
	FLevelStatistics *B = (FLevelStatistics*)b;
	char *p;

	int aday = strtol(A->name, &p, 10);
	int amonth = strtol(p+1, &p, 10);
	int ayear = strtol(p+1, &p, 10);
	int av = aday + 100 * amonth + 2000*ayear;

	int bday = strtol(B->name, &p, 10);
	int bmonth = strtol(p+1, &p, 10);
	int byear = strtol(p+1, &p, 10);
	int bv = bday + 100 * bmonth + 2000*byear;

	return av-bv;
}